

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

bool testing::Mock::VerifyAndClear(void *mock_obj)

{
  bool bVar1;
  void *unaff_RBX;
  
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  ClearDefaultActionsLocked((void *)0x177a1a);
  bVar1 = VerifyAndClearExpectationsLocked(unaff_RBX);
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return bVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  ClearDefaultActionsLocked(mock_obj);
  return VerifyAndClearExpectationsLocked(mock_obj);
}